

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::MergeReturnPass::Process(MergeReturnPass *this)

{
  bool bVar1;
  IRContext *pIVar2;
  FeatureManager *this_00;
  undefined1 auStack_58 [7];
  bool modified;
  bool local_50;
  MergeReturnPass *local_48;
  undefined1 local_40 [8];
  ProcessFunction pfn;
  bool failed;
  bool is_shader;
  MergeReturnPass *this_local;
  
  pIVar2 = Pass::context((Pass *)this);
  this_00 = IRContext::get_feature_mgr(pIVar2);
  local_50 = FeatureManager::HasCapability(this_00,Shader);
  pfn._M_invoker._6_1_ = 0;
  _auStack_58 = (bool *)((long)&pfn._M_invoker + 6);
  local_48 = this;
  pfn._M_invoker._7_1_ = local_50;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::MergeReturnPass::Process()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_40,
             (anon_class_24_3_7d842cb6 *)auStack_58);
  pIVar2 = Pass::context((Pass *)this);
  bVar1 = IRContext::ProcessReachableCallTree(pIVar2,(ProcessFunction *)local_40);
  if ((pfn._M_invoker._6_1_ & 1) == 0) {
    this_local._4_4_ = SuccessWithoutChange;
    if (bVar1) {
      this_local._4_4_ = SuccessWithChange;
    }
  }
  else {
    this_local._4_4_ = Failure;
  }
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_40);
  return this_local._4_4_;
}

Assistant:

Pass::Status MergeReturnPass::Process() {
  bool is_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);

  bool failed = false;
  ProcessFunction pfn = [&failed, is_shader, this](Function* function) {
    std::vector<BasicBlock*> return_blocks = CollectReturnBlocks(function);
    if (return_blocks.size() <= 1) {
      if (!is_shader || return_blocks.size() == 0) {
        return false;
      }
      bool isInConstruct =
          context()->GetStructuredCFGAnalysis()->ContainingConstruct(
              return_blocks[0]->id()) != 0;
      bool endsWithReturn = return_blocks[0] == function->tail();
      if (!isInConstruct && endsWithReturn) {
        return false;
      }
    }

    function_ = function;
    return_flag_ = nullptr;
    return_value_ = nullptr;
    final_return_block_ = nullptr;

    if (is_shader) {
      if (!ProcessStructured(function, return_blocks)) {
        failed = true;
      }
    } else {
      MergeReturnBlocks(function, return_blocks);
    }
    return true;
  };

  bool modified = context()->ProcessReachableCallTree(pfn);

  if (failed) {
    return Status::Failure;
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}